

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootup.c
# Opt level: O3

void __thiscall CMud::LoadOptions(CMud *this)

{
  Config *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  _Alloc_hider __nptr;
  int *piVar3;
  long lVar4;
  undefined8 uVar5;
  string local_58;
  char *local_38;
  
  this_00 = &this->Settings;
  Config::GetValue_abi_cxx11_(&local_58,this_00,"Port");
  __nptr._M_p = local_58._M_dataplus._M_p;
  piVar3 = __errno_location();
  iVar2 = *piVar3;
  *piVar3 = 0;
  lVar4 = strtol(__nptr._M_p,&local_38,10);
  if (local_38 == __nptr._M_p) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((int)lVar4 == lVar4) && (*piVar3 != 0x22)) {
    if (*piVar3 == 0) {
      *piVar3 = iVar2;
    }
    this->game_port = (int)lVar4;
    paVar1 = &local_58.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    Config::GetValue_abi_cxx11_(&local_58,this_00,"BaseDir");
    RString::operator=(&this->base_directory,local_58._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    Config::GetValue_abi_cxx11_(&local_58,this_00,"PlayerDir");
    RString::operator=(&this->player_dir,local_58._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != paVar1) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  uVar5 = std::__throw_out_of_range("stoi");
  if (local_58._M_dataplus._M_p != __nptr._M_p) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(uVar5);
}

Assistant:

void CMud::LoadOptions()
{
	game_port = stoi(Settings.GetValue("Port"));
	base_directory = (Settings.GetValue("BaseDir").c_str());
	player_dir = (Settings.GetValue("PlayerDir").c_str());
}